

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_inst.c
# Opt level: O2

void brTable_op(vm *v,instruction *inst)

{
  uint64 uVar1;
  labelIndex *plVar2;
  
  plVar2 = (labelIndex *)inst->arg;
  uVar1 = popU64(&v->operandStack);
  if (uVar1 < plVar2[1]) {
    plVar2 = (labelIndex *)(uVar1 * 4 + *(long *)(plVar2 + 2));
  }
  br(v,*plVar2);
  return;
}

Assistant:

void brTable_op(vm *v, instruction *inst) {
    stack *s = &v->operandStack;
    brTableArgs *bta = (brTableArgs *) inst->arg;
    uint64 t_index = popU64(s);
    labelIndex l_index = bta->defaultLabels;
    if (t_index < bta->labelCount)
        l_index = *(bta->labels + t_index);
    br(v, l_index);
}